

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

void secp256k1_context_preallocated_destroy(secp256k1_context *ctx)

{
  if (ctx != (secp256k1_context *)0x0) {
    if ((ctx->ecmult_gen_ctx).built == 0) {
      secp256k1_context_preallocated_destroy_cold_1();
      return;
    }
    (ctx->ecmult_gen_ctx).built = 0;
    (ctx->ecmult_gen_ctx).proj_blind.n[0] = 0;
    (ctx->ecmult_gen_ctx).proj_blind.n[1] = 0;
    (ctx->ecmult_gen_ctx).proj_blind.n[2] = 0;
    (ctx->ecmult_gen_ctx).proj_blind.n[3] = 0;
    (ctx->ecmult_gen_ctx).proj_blind.n[4] = 0;
    (ctx->ecmult_gen_ctx).scalar_offset.d[0] = 0;
    (ctx->ecmult_gen_ctx).scalar_offset.d[1] = 0;
    (ctx->ecmult_gen_ctx).scalar_offset.d[2] = 0;
    (ctx->ecmult_gen_ctx).scalar_offset.d[3] = 0;
    (ctx->ecmult_gen_ctx).ge_offset.x.n[0] = 0;
    (ctx->ecmult_gen_ctx).ge_offset.x.n[1] = 0;
    (ctx->ecmult_gen_ctx).ge_offset.x.n[2] = 0;
    (ctx->ecmult_gen_ctx).ge_offset.x.n[3] = 0;
    (ctx->ecmult_gen_ctx).ge_offset.x.n[4] = 0;
    (ctx->ecmult_gen_ctx).ge_offset.y.n[0] = 0;
    (ctx->ecmult_gen_ctx).ge_offset.y.n[1] = 0;
    (ctx->ecmult_gen_ctx).ge_offset.y.n[2] = 0;
    (ctx->ecmult_gen_ctx).ge_offset.y.n[3] = 0;
    (ctx->ecmult_gen_ctx).ge_offset.y.n[4] = 0;
    (ctx->ecmult_gen_ctx).ge_offset.infinity = 0;
  }
  return;
}

Assistant:

void secp256k1_context_preallocated_destroy(secp256k1_context* ctx) {
    ARG_CHECK_VOID(ctx == NULL || secp256k1_context_is_proper(ctx));

    /* Defined as noop */
    if (ctx == NULL) {
        return;
    }

    secp256k1_ecmult_gen_context_clear(&ctx->ecmult_gen_ctx);
}